

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_ln(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  char *new_ext;
  char *local_10;
  
  if (((this->super_CVmObject).ext_[4] & 9U) == 0) {
    iVar1 = setup_getp_0(this,self,retval,argc,&local_10);
    if (iVar1 == 0) {
      compute_ln_into(local_10,(this->super_CVmObject).ext_);
      sp_ = sp_ + -1;
    }
    return 1;
  }
  err_throw(0x7eb);
}

Assistant:

int CVmObjBigNum::getp_ln(VMG_ vm_obj_id_t self,
                          vm_val_t *retval, uint *argc)
{
    char *new_ext;

    /* zero or negative values are not allowed */
    if (is_zero(ext_) || get_neg(ext_))
        err_throw(VMERR_OUT_OF_RANGE);

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* compute the natural logarithm */
    compute_ln_into(new_ext, ext_);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}